

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_add_extension(nifti_image *nim,char *data,int len,int ecode)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  nifti1_extension ext;
  nifti1_extension local_40;
  
  if ((data == (char *)0x0) || (len < 0)) {
    fprintf(_stderr,"** fill_ext: bad params (%p,%p,%d)\n",&local_40,data,(ulong)(uint)len);
  }
  else {
    if ((0x28 < (uint)ecode) || ((ecode & 1U) != 0)) {
      fprintf(_stderr,"** warning: writing unknown ecode %d\n",(ulong)(uint)ecode);
    }
    local_40.esize = len + 0x17U & 0x7ffffff0;
    if ((len + 8U & 0xf) == 0) {
      local_40.esize = len + 8U;
    }
    uVar2 = (ulong)(uint)local_40.esize;
    uVar3 = local_40.esize - 8;
    local_40.edata = (char *)calloc((long)(int)uVar3,1);
    if (local_40.edata != (char *)0x0) {
      memcpy(local_40.edata,data,(ulong)(uint)len);
      local_40.ecode = ecode;
      if (2 < g_opts_0) {
        fprintf(_stderr,"+d alloc %d bytes for ext len %d, ecode %d, esize %d\n",(ulong)uVar3,
                (ulong)(uint)len,(ulong)(uint)ecode,uVar2);
      }
      iVar1 = nifti_add_exten_to_list(&local_40,&nim->ext_list,nim->num_ext + 1);
      if (iVar1 != 0) {
        return -1;
      }
      nim->num_ext = nim->num_ext + 1;
      return 0;
    }
    fprintf(_stderr,"** NFE: failed to alloc %d bytes for extension\n",(ulong)(uint)len);
  }
  return -1;
}

Assistant:

int nifti_add_extension(nifti_image *nim, const char * data, int len, int ecode)
{
   nifti1_extension ext;

   /* error are printed in functions */
   if( nifti_fill_extension(&ext, data, len, ecode) )                 return -1;
   if( nifti_add_exten_to_list(&ext, &nim->ext_list, nim->num_ext+1)) return -1;

   nim->num_ext++;  /* success, so increment */

   return 0;
}